

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

String * __thiscall
capnp::JsonCodec::encode(String *__return_storage_ptr__,JsonCodec *this,Reader *value,Type type)

{
  Reader value_00;
  Reader input;
  Builder output;
  Type type_00;
  undefined8 in_stack_fffffffffffffe30;
  undefined8 uStack_1c8;
  Builder json;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  Reader local_168;
  MallocMessageBuilder message;
  
  MallocMessageBuilder::MallocMessageBuilder(&message,0x80,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnp::json::Value>(&json,&message.super_MessageBuilder);
  DynamicValue::Reader::Reader(&local_168,value);
  input.field_1.anyPointerValue.reader.segment = (SegmentReader *)json._builder.capTable;
  input._0_8_ = json._builder.segment;
  input.field_1.structValue.reader.segment = (SegmentReader *)json._builder.data;
  input.field_1.anyPointerValue.reader.pointer = json._builder.pointers;
  input.field_1.listValue.reader.capTable = (CapTableReader *)json._builder._32_8_;
  input.field_1.listValue.reader.ptr = (byte *)in_stack_fffffffffffffe30;
  input.field_1._40_8_ = uStack_1c8;
  input.field_1._48_8_ = json._builder.segment;
  input.field_1._56_8_ = json._builder.capTable;
  output._builder.capTable = (CapTableBuilder *)json._builder.pointers;
  output._builder.segment = (SegmentBuilder *)json._builder.data;
  output._builder.data = (void *)json._builder._32_8_;
  output._builder.pointers = (WirePointer *)local_198;
  output._builder._32_8_ = uStack_190;
  type_00.field_4.scopeId = type._0_8_;
  type_00._0_8_ = &local_168;
  encode(this,input,type_00,output);
  DynamicValue::Reader::~Reader(&local_168);
  capnp::_::StructBuilder::asReader(&json._builder);
  value_00._reader.capTable = (CapTableReader *)uStack_190;
  value_00._reader.segment = (SegmentReader *)local_198;
  value_00._reader.data = (void *)local_188;
  value_00._reader.pointers = (WirePointer *)uStack_180;
  value_00._reader._32_8_ = local_178;
  value_00._reader._40_8_ = uStack_170;
  encodeRaw(__return_storage_ptr__,this,value_00);
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  return __return_storage_ptr__;
}

Assistant:

kj::String JsonCodec::encode(DynamicValue::Reader value, Type type) const {
  MallocMessageBuilder message(128);
  // Use a smaller initial segment size, this significantly improves performance when encoding
  // short strings.

  auto json = message.getRoot<JsonValue>();
  encode(value, type, json);
  return encodeRaw(json);
}